

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O3

void __thiscall IPAsirMiniSAT::~IPAsirMiniSAT(IPAsirMiniSAT *this)

{
  Lit *pLVar1;
  
  (this->super_SimpSolver).super_Solver._vptr_Solver = (_func_int **)&PTR__IPAsirMiniSAT_00138ce0;
  if (this->fmap != (uchar *)0x0) {
    operator_delete__(this->fmap);
    this->fmap = (uchar *)0x0;
    this->szfmap = 0;
  }
  pLVar1 = (this->clause).data;
  if (pLVar1 != (Lit *)0x0) {
    (this->clause).sz = 0;
    free(pLVar1);
    (this->clause).data = (Lit *)0x0;
    (this->clause).cap = 0;
  }
  pLVar1 = (this->assumptions).data;
  if (pLVar1 != (Lit *)0x0) {
    (this->assumptions).sz = 0;
    free(pLVar1);
    (this->assumptions).data = (Lit *)0x0;
    (this->assumptions).cap = 0;
  }
  Minisat::SimpSolver::~SimpSolver(&this->super_SimpSolver);
  return;
}

Assistant:

~IPAsirMiniSAT() { reset(); }